

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_wav_get_data_format
                    (ma_wav *pWav,ma_format *pFormat,ma_uint32 *pChannels,ma_uint32 *pSampleRate,
                    ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_result mVar1;
  
  if (pFormat != (ma_format *)0x0) {
    *pFormat = ma_format_unknown;
  }
  if (pChannels != (ma_uint32 *)0x0) {
    *pChannels = 0;
  }
  if (pSampleRate != (ma_uint32 *)0x0) {
    *pSampleRate = 0;
  }
  if (channelMapCap != 0 && pChannelMap != (ma_channel *)0x0) {
    memset(pChannelMap,0,channelMapCap);
  }
  if (pWav == (ma_wav *)0x0) {
    mVar1 = MA_INVALID_OPERATION;
  }
  else {
    if (pFormat != (ma_format *)0x0) {
      *pFormat = pWav->format;
    }
    if (pChannels != (ma_uint32 *)0x0) {
      *pChannels = (uint)(pWav->dr).channels;
    }
    if (pSampleRate != (ma_uint32 *)0x0) {
      *pSampleRate = (pWav->dr).sampleRate;
    }
    if (pChannelMap == (ma_channel *)0x0) {
      mVar1 = MA_SUCCESS;
    }
    else {
      mVar1 = MA_SUCCESS;
      ma_channel_map_init_standard
                (ma_standard_channel_map_default,pChannelMap,channelMapCap,(uint)(pWav->dr).channels
                );
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_wav_get_data_format(ma_wav* pWav, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    /* Defaults for safety. */
    if (pFormat != NULL) {
        *pFormat = ma_format_unknown;
    }
    if (pChannels != NULL) {
        *pChannels = 0;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = 0;
    }
    if (pChannelMap != NULL) {
        MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channelMapCap);
    }

    if (pWav == NULL) {
        return MA_INVALID_OPERATION;
    }

    if (pFormat != NULL) {
        *pFormat = pWav->format;
    }

    #if !defined(MA_NO_WAV)
    {
        if (pChannels != NULL) {
            *pChannels = pWav->dr.channels;
        }

        if (pSampleRate != NULL) {
            *pSampleRate = pWav->dr.sampleRate;
        }

        if (pChannelMap != NULL) {
            ma_channel_map_init_standard(ma_standard_channel_map_microsoft, pChannelMap, channelMapCap, pWav->dr.channels);
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}